

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O3

void __thiscall
ipx::Model::EvaluateBasicSolution
          (Model *this,Vector *x_solver,Vector *y_solver,Vector *z_solver,
          vector<int,_std::allocator<int>_> *basic_status_solver,Info *info)

{
  int iVar1;
  int iVar2;
  double *pdVar3;
  double *pdVar4;
  pointer pcVar5;
  double *__s;
  double *__s_00;
  double *__s_01;
  double *__s_02;
  double *__s_03;
  double *__s_04;
  double *__s_05;
  char cVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  Vector x;
  Vector zinfeas;
  Vector yinfeas;
  Vector sinfeas;
  Vector xinfeas;
  Vector z;
  Vector y;
  Vector slack;
  vector<int,_std::allocator<int>_> vbasis;
  vector<int,_std::allocator<int>_> local_78;
  vector<int,_std::allocator<int>_> cbasis;
  vector<int,_std::allocator<int>_> local_48;
  
  x._M_size = (size_t)this->num_var_;
  uVar8 = x._M_size << 3;
  x._M_data = (double *)operator_new(uVar8);
  memset(x._M_data,0,uVar8);
  slack._M_size = (size_t)this->num_constr_;
  uVar8 = slack._M_size << 3;
  __s = (double *)operator_new(uVar8);
  slack._M_data = __s;
  memset(__s,0,uVar8);
  y._M_size = (size_t)this->num_constr_;
  uVar8 = y._M_size << 3;
  __s_00 = (double *)operator_new(uVar8);
  y._M_data = __s_00;
  memset(__s_00,0,uVar8);
  z._M_size = (size_t)this->num_var_;
  uVar8 = z._M_size << 3;
  __s_01 = (double *)operator_new(uVar8);
  z._M_data = __s_01;
  memset(__s_01,0,uVar8);
  std::vector<int,_std::allocator<int>_>::vector
            (&cbasis,(long)this->num_constr_,(allocator_type *)&vbasis);
  std::vector<int,_std::allocator<int>_>::vector
            (&vbasis,(long)this->num_var_,(allocator_type *)&xinfeas);
  DualizeBackBasicSolution(this,x_solver,y_solver,z_solver,&x,&slack,&y,&z);
  DualizeBackBasis(this,basic_status_solver,&cbasis,&vbasis);
  std::vector<int,_std::allocator<int>_>::vector(&local_78,&cbasis);
  std::vector<int,_std::allocator<int>_>::vector(&local_48,&vbasis);
  CorrectScaledBasicSolution(this,&x,&slack,&y,&z,&local_78,&local_48);
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  dVar9 = Dot(&this->scaled_obj_,&x);
  xinfeas._M_size = (size_t)this->num_var_;
  uVar8 = xinfeas._M_size << 3;
  __s_02 = (double *)operator_new(uVar8);
  xinfeas._M_data = __s_02;
  memset(__s_02,0,uVar8);
  sinfeas._M_size = (size_t)this->num_constr_;
  uVar8 = sinfeas._M_size << 3;
  __s_03 = (double *)operator_new(uVar8);
  sinfeas._M_data = __s_03;
  memset(__s_03,0,uVar8);
  yinfeas._M_size = (size_t)this->num_constr_;
  uVar8 = yinfeas._M_size << 3;
  __s_04 = (double *)operator_new(uVar8);
  yinfeas._M_data = __s_04;
  memset(__s_04,0,uVar8);
  zinfeas._M_size = (size_t)this->num_var_;
  uVar8 = zinfeas._M_size << 3;
  __s_05 = (double *)operator_new(uVar8);
  zinfeas._M_data = __s_05;
  memset(__s_05,0,uVar8);
  iVar1 = this->num_var_;
  if (0 < (long)iVar1) {
    pdVar3 = (this->scaled_lbuser_)._M_data;
    pdVar4 = (this->scaled_ubuser_)._M_data;
    lVar7 = 0;
    do {
      dVar11 = *(double *)((long)x._M_data + lVar7 * 2);
      dVar10 = *(double *)((long)pdVar3 + lVar7 * 2);
      if (dVar11 < dVar10) {
        *(double *)((long)__s_02 + lVar7 * 2) = dVar11 - dVar10;
        dVar11 = *(double *)((long)x._M_data + lVar7 * 2);
      }
      dVar10 = *(double *)((long)pdVar4 + lVar7 * 2);
      if (dVar10 < dVar11) {
        *(double *)((long)__s_02 + lVar7 * 2) = dVar11 - dVar10;
      }
      iVar2 = *(int *)((long)vbasis.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar7);
      dVar11 = *(double *)((long)__s_01 + lVar7 * 2);
      if (iVar2 == -1) {
LAB_003ac57e:
        if (dVar11 < 0.0) {
          *(double *)((long)__s_05 + lVar7 * 2) = dVar11;
        }
      }
      else {
        if (0.0 < dVar11) {
          *(double *)((long)__s_05 + lVar7 * 2) = dVar11;
        }
        if (iVar2 != -2) goto LAB_003ac57e;
      }
      lVar7 = lVar7 + 4;
    } while ((long)iVar1 * 4 != lVar7);
  }
  iVar1 = this->num_constr_;
  if (0 < (long)iVar1) {
    pcVar5 = (this->constr_type_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = 0;
    do {
      cVar6 = pcVar5[lVar7];
      if (cVar6 == '<') {
        if (__s[lVar7] < 0.0) {
          __s_03[lVar7] = __s[lVar7];
        }
        if (0.0 < __s_00[lVar7]) {
          __s_04[lVar7] = __s_00[lVar7];
        }
        cVar6 = pcVar5[lVar7];
      }
      if (cVar6 == '>') {
        if (0.0 < __s[lVar7]) {
          __s_03[lVar7] = __s[lVar7];
        }
        if (__s_00[lVar7] < 0.0) {
          __s_04[lVar7] = __s_00[lVar7];
        }
      }
      lVar7 = lVar7 + 1;
    } while (iVar1 != lVar7);
  }
  ScaleBackBasicSolution(this,&x,&slack,&y,&z);
  ScaleBackBasicSolution(this,&xinfeas,&sinfeas,&yinfeas,&zinfeas);
  dVar10 = Infnorm(&xinfeas);
  dVar11 = Infnorm(&sinfeas);
  if (dVar11 <= dVar10) {
    dVar11 = dVar10;
  }
  (info->super_ipx_info).primal_infeas = dVar11;
  dVar10 = Infnorm(&zinfeas);
  dVar11 = Infnorm(&yinfeas);
  if (dVar11 <= dVar10) {
    dVar11 = dVar10;
  }
  (info->super_ipx_info).dual_infeas = dVar11;
  (info->super_ipx_info).objval = dVar9;
  operator_delete(zinfeas._M_data);
  operator_delete(yinfeas._M_data);
  operator_delete(sinfeas._M_data);
  operator_delete(xinfeas._M_data);
  if (vbasis.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(vbasis.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (cbasis.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(cbasis.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  operator_delete(__s_01);
  operator_delete(__s_00);
  operator_delete(__s);
  operator_delete(x._M_data);
  return;
}

Assistant:

void Model::EvaluateBasicSolution(const Vector& x_solver,
                                  const Vector& y_solver,
                                  const Vector& z_solver,
                                  const std::vector<Int>& basic_status_solver,
                                  Info* info) const {
    const Int m = rows();
    const Int n = cols();
    assert((Int)x_solver.size() == n+m);
    assert((Int)y_solver.size() == m);
    assert((Int)z_solver.size() == n+m);
    assert((Int)basic_status_solver.size() == n+m);

    // Build basic solution to scaled user model.
    Vector x(num_var_);
    Vector slack(num_constr_);
    Vector y(num_constr_);
    Vector z(num_var_);
    std::vector<Int> cbasis(num_constr_);
    std::vector<Int> vbasis(num_var_);
    DualizeBackBasicSolution(x_solver, y_solver, z_solver, x, slack, y, z);
    DualizeBackBasis(basic_status_solver, cbasis, vbasis);
    CorrectScaledBasicSolution(x, slack, y, z, cbasis, vbasis);
    double pobj = Dot(scaled_obj_, x);

    // Build infeasibilities in scaled user model.
    Vector xinfeas(num_var_);
    Vector sinfeas(num_constr_);
    Vector yinfeas(num_constr_);
    Vector zinfeas(num_var_);
    for (Int j = 0; j < num_var_; j++) {
        if (x[j] < scaled_lbuser_[j])
            xinfeas[j] = x[j]-scaled_lbuser_[j];
        if (x[j] > scaled_ubuser_[j])
            xinfeas[j] = x[j]-scaled_ubuser_[j];
        if (vbasis[j] != IPX_nonbasic_lb && z[j] > 0.0)
            zinfeas[j] = z[j];
        if (vbasis[j] != IPX_nonbasic_ub && z[j] < 0.0)
            zinfeas[j] = z[j];
    }
    for (Int i = 0; i < num_constr_; i++) {
        if (constr_type_[i] == '<') {
            if (slack[i] < 0.0)
                sinfeas[i] = slack[i];
            if (y[i] > 0.0)
                yinfeas[i] = y[i];
        }
        if (constr_type_[i] == '>') {
            if (slack[i] > 0.0)
                sinfeas[i] = slack[i];
            if (y[i] < 0.0)
                yinfeas[i] = y[i];
        }
    }

    // Scale back basic solution and infeasibilities.
    ScaleBackBasicSolution(x, slack, y, z);
    ScaleBackBasicSolution(xinfeas, sinfeas, yinfeas, zinfeas);

    info->primal_infeas = std::max(Infnorm(xinfeas), Infnorm(sinfeas));
    info->dual_infeas = std::max(Infnorm(zinfeas), Infnorm(yinfeas));
    info->objval = pobj;
}